

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

MultiFab * __thiscall NavierStokesBase::get_rho(NavierStokesBase *this,Real time)

{
  TimeLevel TVar1;
  long in_RDI;
  char *in_XMM0_Qa;
  TimeLevel whichTime;
  Real in_stack_00000038;
  int in_stack_00000044;
  AmrLevel *in_stack_00000048;
  NavierStokesBase *in_stack_00000200;
  undefined8 local_10;
  
  TVar1 = amrex::AmrLevel::which_time(in_stack_00000048,in_stack_00000044,in_stack_00000038);
  if (TVar1 == AmrOldTime) {
    local_10 = (MultiFab *)(in_RDI + 0x13b0);
  }
  else if (TVar1 == AmrNewTime) {
    local_10 = (MultiFab *)(in_RDI + 0x1530);
  }
  else if (TVar1 == Amr1QtrTime) {
    local_10 = *(MultiFab **)(in_RDI + 0x13a0);
  }
  else if (TVar1 == Amr3QtrTime) {
    local_10 = *(MultiFab **)(in_RDI + 0x13a8);
  }
  else if (TVar1 == AmrHalfTime) {
    local_10 = get_rho_half_time(in_stack_00000200);
  }
  else {
    amrex::Error_host(in_XMM0_Qa);
    local_10 = (MultiFab *)(in_RDI + 0x13b0);
  }
  return local_10;
}

Assistant:

const MultiFab&
NavierStokesBase::get_rho (Real time)
{
    const TimeLevel whichTime = which_time(State_Type,time);

    if (whichTime == AmrOldTime)
    {
        return rho_ptime;
    }
    else if (whichTime == AmrNewTime)
    {
        return rho_ctime;
    }
    else if (whichTime == Amr1QtrTime)
    {
        AMREX_ASSERT(rho_qtime);
        return *rho_qtime;
    }
    else if (whichTime == Amr3QtrTime)
    {
        AMREX_ASSERT(rho_tqtime);
        return *rho_tqtime;
    }
    else if (whichTime == AmrHalfTime)
    {
        return get_rho_half_time();
    }
    else
    {
        amrex::Error("NavierStokesBase::get_rho(): bad time");
        return rho_ptime; // Got to return something to shut up compiler.
    }
}